

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O3

bool __thiscall irr::scene::CB3DMeshFileLoader::readChunkTEXS(CB3DMeshFileLoader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  pointer pSVar4;
  size_type sVar5;
  pointer pcVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  size_type sVar9;
  void *pvVar10;
  void *__src;
  SB3dTexture local_70;
  
  lVar3 = *(long *)&(this->super_IMeshLoader).field_0x10;
  iVar2 = *(int *)(lVar3 + -0xc);
  lVar3 = *(long *)(lVar3 + -8);
  iVar7 = (*this->B3DFile->_vptr_IReadFile[3])();
  if (CONCAT44(extraout_var,iVar7) < iVar2 + lVar3) {
    paVar1 = &local_70.TextureName.field_2;
    do {
      local_70.Xscale = 0.0;
      local_70.Yscale = 0.0;
      local_70.Angle = 0.0;
      local_70._60_4_ = 0;
      local_70.Flags = 0;
      local_70.Blend = 0;
      local_70.Xpos = 0.0;
      local_70.Ypos = 0.0;
      local_70.TextureName.field_2._M_allocated_capacity = 0;
      local_70.TextureName.field_2._8_8_ = 0;
      local_70.TextureName._M_string_length = 0;
      local_70.TextureName._M_dataplus._M_p = (pointer)paVar1;
      ::std::vector<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>::
      emplace_back<irr::scene::SB3dTexture>(&(this->Textures).m_data,&local_70);
      (this->Textures).is_sorted = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.TextureName._M_dataplus._M_p != paVar1) {
        operator_delete(local_70.TextureName._M_dataplus._M_p,
                        local_70.TextureName.field_2._M_allocated_capacity + 1);
      }
      pSVar4 = (this->Textures).m_data.
               super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      readString_abi_cxx11_(&local_70.TextureName,this);
      ::std::__cxx11::string::operator=((string *)(pSVar4 + -1),(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.TextureName._M_dataplus._M_p != paVar1) {
        operator_delete(local_70.TextureName._M_dataplus._M_p,
                        local_70.TextureName.field_2._M_allocated_capacity + 1);
      }
      sVar5 = pSVar4[-1].TextureName._M_string_length;
      if (sVar5 != 0) {
        pcVar6 = pSVar4[-1].TextureName._M_dataplus._M_p;
        sVar9 = 0;
        do {
          if (pcVar6[sVar9] == '\\') {
            pcVar6[sVar9] = '/';
          }
          sVar9 = sVar9 + 1;
        } while (sVar5 != sVar9);
      }
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].Flags,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].Blend,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].Xpos,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].Ypos,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].Xscale,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].Yscale,4);
      (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&pSVar4[-1].Angle,4);
      lVar3 = *(long *)&(this->super_IMeshLoader).field_0x10;
      iVar2 = *(int *)(lVar3 + -0xc);
      lVar3 = *(long *)(lVar3 + -8);
      iVar7 = (*this->B3DFile->_vptr_IReadFile[3])();
    } while (CONCAT44(extraout_var_00,iVar7) < iVar2 + lVar3);
  }
  lVar3 = *(long *)&(this->super_IMeshLoader).field_0x8;
  pvVar10 = *(void **)&(this->super_IMeshLoader).field_0x10;
  uVar8 = (long)pvVar10 + (0xffffffff0 - lVar3) & 0xffffffff0;
  __src = (void *)(lVar3 + uVar8 + 0x10);
  if (__src != pvVar10) {
    memmove((void *)(lVar3 + uVar8),__src,(long)pvVar10 - (long)__src);
    pvVar10 = *(void **)&(this->super_IMeshLoader).field_0x10;
  }
  *(long *)&(this->super_IMeshLoader).field_0x10 = (long)pvVar10 + -0x10;
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkTEXS()
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkTEXS";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
	{
		Textures.push_back(SB3dTexture());
		SB3dTexture &B3dTexture = Textures.getLast();

		B3dTexture.TextureName = readString();
		std::replace(B3dTexture.TextureName.begin(), B3dTexture.TextureName.end(), '\\', '/');
#ifdef _B3D_READER_DEBUG
		os::Printer::log("read Texture", B3dTexture.TextureName.c_str(), ELL_DEBUG);
#endif

		B3DFile->read(&B3dTexture.Flags, sizeof(s32));
		B3DFile->read(&B3dTexture.Blend, sizeof(s32));
#ifdef __BIG_ENDIAN__
		B3dTexture.Flags = os::Byteswap::byteswap(B3dTexture.Flags);
		B3dTexture.Blend = os::Byteswap::byteswap(B3dTexture.Blend);
#endif
#ifdef _B3D_READER_DEBUG
		os::Printer::log("Flags", core::stringc(B3dTexture.Flags).c_str(), ELL_DEBUG);
		os::Printer::log("Blend", core::stringc(B3dTexture.Blend).c_str(), ELL_DEBUG);
#endif
		readFloats(&B3dTexture.Xpos, 1);
		readFloats(&B3dTexture.Ypos, 1);
		readFloats(&B3dTexture.Xscale, 1);
		readFloats(&B3dTexture.Yscale, 1);
		readFloats(&B3dTexture.Angle, 1);
	}

	B3dStack.erase(B3dStack.size() - 1);

	return true;
}